

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinPC07_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  double rho_a;
  double dVar6;
  double dVar7;
  double sigma_bb;
  double dVar8;
  double tau_a;
  double tau_b;
  
  if (0 < N) {
    pdVar4 = sigma + 2;
    lVar3 = 0;
    do {
      dVar6 = *(double *)((long)rho + lVar3 * 2);
      dVar7 = *(double *)((long)rho + lVar3 * 2 + 8);
      if (dVar6 + dVar7 <= 1e-15) {
        *(double *)((long)eps + lVar3) = 0.0;
      }
      else {
        rho_a = 1e-15;
        if (1e-15 <= dVar6) {
          rho_a = dVar6;
        }
        dVar6 = 1e-15;
        if (1e-15 <= dVar7) {
          dVar6 = dVar7;
        }
        dVar7 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= pdVar4[-2]) {
          dVar7 = pdVar4[-2];
        }
        sigma_bb = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= *pdVar4) {
          sigma_bb = *pdVar4;
        }
        dVar8 = (sigma_bb + dVar7) * 0.5;
        uVar5 = -(ulong)(-dVar8 <= pdVar4[-1]);
        dVar2 = (double)(uVar5 & (ulong)pdVar4[-1] | ~uVar5 & (ulong)-dVar8);
        uVar5 = -(ulong)(dVar2 <= dVar8);
        dVar1 = *(double *)((long)tau + lVar3 * 2);
        tau_a = 0.0;
        if (0.0 <= dVar1) {
          tau_a = dVar1;
        }
        dVar1 = *(double *)((long)tau + lVar3 * 2 + 8);
        tau_b = 0.0;
        if (0.0 <= dVar1) {
          tau_b = dVar1;
        }
        kernel_traits<ExchCXX::BuiltinPC07_K>::eval_exc_polar_impl
                  (rho_a,dVar6,dVar7,(double)(~uVar5 & (ulong)dVar8 | uVar5 & (ulong)dVar2),sigma_bb
                   ,*(double *)((long)lapl + lVar3 * 2),*(double *)((long)lapl + lVar3 * 2 + 8),
                   tau_a,tau_b,(double *)((long)eps + lVar3));
      }
      pdVar4 = pdVar4 + 3;
      lVar3 = lVar3 + 8;
    } while ((ulong)(uint)N << 3 != lVar3);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      eps[i] );

  }

}